

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                    *this,XprType *xpr)

{
  PointerType pfVar1;
  undefined8 uVar2;
  XprTypeNested pMVar3;
  long lVar4;
  LhsNestedCleaned *pLVar5;
  RhsNestedCleaned *pRVar6;
  Index IVar7;
  XprType *xpr_local;
  product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  *this_local;
  
  evaluator_base<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>
  ::evaluator_base((evaluator_base<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>
                    *)this);
  pLVar5 = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>
           ::lhs(xpr);
  pfVar1 = (pLVar5->
           super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>).
           super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.
           m_data;
  uVar2 = *(undefined8 *)
           &(pLVar5->
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>).
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.
            field_0x8;
  pMVar3 = (pLVar5->
           super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>).
           super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_xpr
  ;
  lVar4 = (pLVar5->
          super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>).
          super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
          m_startRow.m_value;
  IVar7 = (pLVar5->
          super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>).
          super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
          m_outerStride;
  (this->m_lhs).
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_startCol.
  m_value = (pLVar5->
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>).
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
            m_startCol.m_value;
  (this->m_lhs).
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_outerStride
       = IVar7;
  (this->m_lhs).
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_xpr = pMVar3
  ;
  (this->m_lhs).
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_startRow.
  m_value = lVar4;
  (this->m_lhs).
  super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.m_data =
       pfVar1;
  *(undefined8 *)
   &(this->m_lhs).
    super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.field_0x8
       = uVar2;
  pRVar6 = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>
           ::rhs(xpr);
  this->m_rhs = pRVar6;
  evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>_>::evaluator
            (&this->m_lhsImpl,&this->m_lhs);
  evaluator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::evaluator(&this->m_rhsImpl,this->m_rhs);
  pLVar5 = Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>
           ::lhs(xpr);
  IVar7 = MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>::cols
                    ((MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>
                      *)pLVar5);
  this->m_innerDim = IVar7;
  return;
}

Assistant:

explicit product_evaluator(const XprType& xpr)
    : m_lhs(xpr.lhs()),
      m_rhs(xpr.rhs()),
      m_lhsImpl(m_lhs),     // FIXME the creation of the evaluator objects should result in a no-op, but check that!
      m_rhsImpl(m_rhs),     //       Moreover, they are only useful for the packet path, so we could completely disable them when not needed,
                            //       or perhaps declare them on the fly on the packet method... We have experiment to check what's best.
      m_innerDim(xpr.lhs().cols())
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::MulCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::AddCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
#if 0
    std::cerr << "LhsOuterStrideBytes=  " << LhsOuterStrideBytes << "\n";
    std::cerr << "RhsOuterStrideBytes=  " << RhsOuterStrideBytes << "\n";
    std::cerr << "LhsAlignment=         " << LhsAlignment << "\n";
    std::cerr << "RhsAlignment=         " << RhsAlignment << "\n";
    std::cerr << "CanVectorizeLhs=      " << CanVectorizeLhs << "\n";
    std::cerr << "CanVectorizeRhs=      " << CanVectorizeRhs << "\n";
    std::cerr << "CanVectorizeInner=    " << CanVectorizeInner << "\n";
    std::cerr << "EvalToRowMajor=       " << EvalToRowMajor << "\n";
    std::cerr << "Alignment=            " << Alignment << "\n";
    std::cerr << "Flags=                " << Flags << "\n";
#endif
  }